

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::RepeatedPrimitiveFieldGenerator::GenerateRepeatedDataSizeCode
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  JavaType type;
  Type type_00;
  int iVar2;
  Printer *printer_local;
  RepeatedPrimitiveFieldGenerator *this_local;
  
  type = GetJavaType(this->descriptor_);
  bVar1 = anon_unknown_5::IsReferenceType(type);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "int dataCount = 0;\nint dataSize = 0;\nfor (int i = 0; i < this.$name$.length; i++) {\n  $type$ element = this.$name$[i];\n  if (element != null) {\n    dataCount++;\n    dataSize += com.google.protobuf.nano.CodedOutputByteBufferNano\n        .compute$capitalized_type$SizeNoTag(element);\n  }\n}\n"
                      );
  }
  else {
    type_00 = FieldDescriptor::type(this->descriptor_);
    iVar2 = anon_unknown_5::FixedSize(type_00);
    if (iVar2 == -1) {
      io::Printer::Print(printer,&this->variables_,
                         "int dataSize = 0;\nfor (int i = 0; i < this.$name$.length; i++) {\n  $type$ element = this.$name$[i];\n  dataSize += com.google.protobuf.nano.CodedOutputByteBufferNano\n      .compute$capitalized_type$SizeNoTag(element);\n}\n"
                        );
    }
    else {
      io::Printer::Print(printer,&this->variables_,
                         "int dataSize = $fixed_size$ * this.$name$.length;\n");
    }
  }
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateRepeatedDataSizeCode(io::Printer* printer) const {
  // Creates a variable dataSize and puts the serialized size in there.
  // If the element type is a Java reference type, also generates
  // dataCount which stores the number of non-null elements in the field.
  if (IsReferenceType(GetJavaType(descriptor_))) {
    printer->Print(variables_,
      "int dataCount = 0;\n"
      "int dataSize = 0;\n"
      "for (int i = 0; i < this.$name$.length; i++) {\n"
      "  $type$ element = this.$name$[i];\n"
      "  if (element != null) {\n"
      "    dataCount++;\n"
      "    dataSize += com.google.protobuf.nano.CodedOutputByteBufferNano\n"
      "        .compute$capitalized_type$SizeNoTag(element);\n"
      "  }\n"
      "}\n");
  } else if (FixedSize(descriptor_->type()) == -1) {
    printer->Print(variables_,
      "int dataSize = 0;\n"
      "for (int i = 0; i < this.$name$.length; i++) {\n"
      "  $type$ element = this.$name$[i];\n"
      "  dataSize += com.google.protobuf.nano.CodedOutputByteBufferNano\n"
      "      .compute$capitalized_type$SizeNoTag(element);\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "int dataSize = $fixed_size$ * this.$name$.length;\n");
  }
}